

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O0

void __thiscall ezexample::~ezexample(ezexample *this)

{
  example **ppeVar1;
  bool bVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  example ***pppeVar3;
  long in_RDI;
  example *ecc;
  example **__end1;
  example **__begin1;
  v_array<example_*> *__range1;
  example *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  example **local_18;
  
  if (((*(byte *)(*(long *)(in_RDI + 0x18) + 0x68cb) & 1) != 0) &&
     (bVar2 = VW::is_ring_example((vw *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0
                                                ),in_stack_ffffffffffffffa8), bVar2)) {
    VW::finish_example((vw *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8);
  }
  this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
            v_array<example_*>::begin((v_array<example_*> *)(in_RDI + 0x158));
  local_18 = (example **)
             (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
  pppeVar3 = v_array<example_*>::end((v_array<example_*> *)(in_RDI + 0x158));
  ppeVar1 = *pppeVar3;
  for (; local_18 != ppeVar1; local_18 = local_18 + 1) {
    if ((((*local_18)->in_use & 1U) != 0) &&
       (in_stack_ffffffffffffffb7 =
             VW::is_ring_example((vw *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0)
                                 ,in_stack_ffffffffffffffa8), (bool)in_stack_ffffffffffffffb7)) {
      VW::finish_example((vw *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffa8);
    }
  }
  v_array<example_*>::clear
            ((v_array<example_*> *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  pppeVar3 = v_array<example_*>::begin((v_array<example_*> *)(in_RDI + 0x158));
  free(*pppeVar3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this_00);
  return;
}

Assistant:

~ezexample()  // calls finish_example *only* if we created our own example!
  {
    if (ec->in_use && VW::is_ring_example(*vw_par_ref, ec))
      VW::finish_example(*vw_par_ref, *ec);
    for (auto ecc : example_copies)
      if (ecc->in_use && VW::is_ring_example(*vw_par_ref, ec))
        VW::finish_example(*vw_par_ref, *ecc);
    example_copies.clear();
    free(example_copies.begin());
  }